

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SceneCombiner.cpp
# Opt level: O3

void Assimp::SceneCombiner::Copy(aiTexture **_dest,aiTexture *src)

{
  aiTexel *__src;
  uint uVar1;
  aiTexture *__dest;
  aiTexel *__dest_00;
  int iVar2;
  
  if (src != (aiTexture *)0x0 && _dest != (aiTexture **)0x0) {
    __dest = (aiTexture *)operator_new(0x428);
    *_dest = __dest;
    memcpy(__dest,src,0x428);
    __src = __dest->pcData;
    if (__src != (aiTexel *)0x0) {
      iVar2 = 1;
      if (__dest->mHeight != 0) {
        iVar2 = __dest->mHeight * 4;
      }
      uVar1 = iVar2 * __dest->mWidth;
      if (uVar1 != 0) {
        __dest_00 = (aiTexel *)operator_new__((ulong)uVar1);
        __dest->pcData = __dest_00;
        memcpy(__dest_00,__src,(ulong)uVar1);
        return;
      }
      __dest->pcData = (aiTexel *)0x0;
    }
  }
  return;
}

Assistant:

void SceneCombiner::Copy(aiTexture** _dest, const aiTexture* src) {
    if ( nullptr == _dest || nullptr == src ) {
        return;
    }

    aiTexture* dest = *_dest = new aiTexture();

    // get a flat copy
    ::memcpy(dest,src,sizeof(aiTexture));

    // and reallocate all arrays. We must do it manually here
    const char* old = (const char*)dest->pcData;
    if (old)
    {
        unsigned int cpy;
        if (!dest->mHeight)cpy = dest->mWidth;
        else cpy = dest->mHeight * dest->mWidth * sizeof(aiTexel);

        if (!cpy)
        {
            dest->pcData = NULL;
            return;
        }
        // the cast is legal, the aiTexel c'tor does nothing important
        dest->pcData = (aiTexel*) new char[cpy];
        ::memcpy(dest->pcData, old, cpy);
    }
}